

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_bxxx_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint local_20;
  int offs;
  int imm_val;
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  local_20 = quads[2] << 8 | quads[1] << 4 | *quads;
  if ((local_20 & 0x800) != 0) {
    local_20 = local_20 | 0xfffff000;
  }
  sh4asm_txt_bsr_offs12(em,local_20 * 2 + 4,pc);
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_bxxx_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    // mask is 0xf000
    int imm_val = (quads[2] << 8) | (quads[1] << 4) | quads[0];
    if (imm_val & (1 << 11))
        imm_val |= ~SH4ASM_BIT_RANGE(0, 11);
    int offs = 2 * imm_val + 4;
    sh4asm_txt_bsr_offs12(em, offs, pc);
}